

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

void dumpTypeName(raw_ostream *OS,DWARFDie *D)

{
  DWARFDebugInfoEntry **this;
  DWARFDie DVar1;
  DWARFDie DVar2;
  DWARFDie DVar3;
  undefined1 auVar4 [16];
  DWARFDie DVar5;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar6;
  char *pcVar7;
  size_t sVar8;
  DWARFAbbreviationDeclaration *pDVar9;
  uint *puVar10;
  OptionalStorage<unsigned_int,_true> OVar11;
  raw_ostream *prVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  char *in_RCX;
  undefined7 uVar16;
  ulong uVar18;
  DWARFDebugInfoEntry *extraout_RDX;
  DWARFDebugInfoEntry *extraout_RDX_00;
  DWARFDebugInfoEntry *pDVar19;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_01;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_02;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_03;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_04;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_05;
  void *__buf;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_06;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_07;
  DWARFUnit *pDVar20;
  DWARFDebugInfoEntry *extraout_RDX_08;
  DWARFDebugInfoEntry *extraout_RDX_09;
  DWARFDebugInfoEntry *extraout_RDX_10;
  int __fd;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar22;
  DWARFUnit *pDVar23;
  uint Tag;
  bool bVar24;
  StringRef SVar25;
  DWARFDie DVar26;
  Optional<unsigned_long> OVar27;
  DWARFDie DVar28;
  DWARFDie DVar29;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  DWARFDie local_d8;
  undefined1 local_c8 [8];
  DWARFDie TypeDie;
  Optional<llvm::DWARFFormValue> L;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_78;
  DWARFDie local_70;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_60;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_58;
  DWARFUnit *local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  DWARFUnit *local_38;
  ulong uVar17;
  DWARFDebugInfoEntry *pDVar21;
  
  if (D->U == (DWARFUnit *)0x0) {
    return;
  }
  if (D->Die == (DWARFDebugInfoEntry *)0x0) {
    return;
  }
  pcVar7 = llvm::DWARFDie::getName(D,LinkageName);
  if (pcVar7 != (char *)0x0) {
    sVar8 = strlen(pcVar7);
    SVar25.Length = sVar8;
    SVar25.Data = pcVar7;
    llvm::raw_ostream::operator<<(OS,SVar25);
    return;
  }
  pDVar9 = llvm::DWARFDie::getAbbreviationDeclarationPtr(D);
  if (pDVar9 == (DWARFAbbreviationDeclaration *)0x0) {
    Tag = 0;
LAB_00d6f55d:
    SVar25 = llvm::dwarf::TagString(Tag);
    uVar17 = SVar25.Length;
    puVar10 = (uint *)SVar25.Data;
    if (((6 < uVar17) &&
        (in_RCX = (char *)(ulong)(*puVar10 ^ 0x545f5744),
        *(int *)((long)puVar10 + 3) == 0x5f474154 && (*puVar10 ^ 0x545f5744) == 0)) &&
       (uVar15 = *(uint *)((long)puVar10 + (uVar17 - 5)) ^ 0x7079745f,
       in_RCX = (char *)(ulong)uVar15, *(char *)((long)puVar10 + (uVar17 - 1)) == 'e' && uVar15 == 0
       )) {
      uVar18 = uVar17 - 7;
      if (uVar17 - 0xc <= uVar17 - 7) {
        uVar18 = uVar17 - 0xc;
      }
      Str.Length = uVar18;
      Str.Data = (char *)((long)puVar10 + 7);
      prVar12 = llvm::raw_ostream::operator<<(OS,Str);
      in_RCX = prVar12->OutBufCur;
      if (prVar12->OutBufEnd == in_RCX) {
        llvm::raw_ostream::write(prVar12,0xe41ea2,(void *)0x1,(size_t)in_RCX);
      }
      else {
        *in_RCX = ' ';
        prVar12->OutBufCur = prVar12->OutBufCur + 1;
      }
    }
  }
  else {
    Tag = (uint)pDVar9->Tag;
    uVar15 = pDVar9->Tag - 0xf;
    in_RCX = (char *)(ulong)uVar15;
    if (((0x33 < uVar15) || ((0x8000000010043U >> ((ulong)in_RCX & 0x3f) & 1) == 0)) && (Tag != 1))
    goto LAB_00d6f55d;
  }
  _local_c8 = llvm::DWARFDie::getAttributeValueAsReferencedDie(D,DW_AT_type);
  dumpTypeName(OS,(DWARFDie *)local_c8);
  DVar28.Die = extraout_RDX;
  DVar28.U = local_38;
  if (Tag < 0x15) {
    if (Tag == 1) {
      pDVar20 = D->U;
      pDVar19 = D->Die;
      if (pDVar19 == (DWARFDebugInfoEntry *)0x0 || pDVar20 == (DWARFUnit *)0x0) {
        local_70 = (DWARFDie)ZEXT816(0);
      }
      else {
        local_70 = llvm::DWARFUnit::getFirstChild(pDVar20,pDVar19);
        pDVar20 = D->U;
        pDVar19 = D->Die;
      }
      if (pDVar19 == (DWARFDebugInfoEntry *)0x0 || pDVar20 == (DWARFUnit *)0x0) {
        DVar26 = (DWARFDie)ZEXT816(0);
      }
      else {
        DVar26 = llvm::DWARFUnit::getLastChild(pDVar20,pDVar19);
      }
      DVar2 = DVar26;
      if (local_70 == DVar26) {
        return;
      }
      do {
        local_38 = (DWARFUnit *)DVar2.Die;
        local_50 = DVar2.U;
        if ((local_70.U == (DWARFUnit *)0x0) || (local_70.Die == (DWARFDebugInfoEntry *)0x0)) {
LAB_00d6fe26:
          local_38 = (DWARFUnit *)DVar2.Die;
          local_50 = DVar2.U;
          __assert_fail("isValid() && \"must check validity prior to calling\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                        ,0x3b,
                        "const DWARFAbbreviationDeclaration *llvm::DWARFDie::getAbbreviationDeclarationPtr() const"
                       );
        }
        pDVar9 = (local_70.Die)->AbbrevDecl;
        if ((pDVar9 != (DWARFAbbreviationDeclaration *)0x0) && (pDVar9->Tag == DW_TAG_subrange_type)
           ) {
          this = &TypeDie.Die;
          llvm::DWARFDie::find((Optional<llvm::DWARFFormValue> *)this,&local_70,DW_AT_lower_bound);
          if (L.Storage.field_0._40_1_ == '\x01') {
            OVar27 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)this);
            aVar22 = OVar27.Storage.field_0;
            local_40 = OVar27.Storage._8_4_;
          }
          else {
            aVar22.value = local_58.value & 0xffffffffffffff00;
            local_40 = 0;
          }
          llvm::DWARFDie::find((Optional<llvm::DWARFFormValue> *)this,&local_70,DW_AT_count);
          if (L.Storage.field_0._40_1_ == '\x01') {
            OVar27 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)this);
            local_60 = OVar27.Storage.field_0;
            local_44 = OVar27.Storage._8_4_;
          }
          else {
            local_60.value = local_60.value & 0xffffffffffffff00;
            local_44 = 0;
          }
          llvm::DWARFDie::find((Optional<llvm::DWARFFormValue> *)this,&local_70,DW_AT_upper_bound);
          local_58 = aVar22;
          if (L.Storage.field_0._40_1_ == '\x01') {
            OVar27 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)this);
            local_78 = OVar27.Storage.field_0;
            local_3c = OVar27.Storage._8_4_;
          }
          else {
            local_78.value = local_78.value & 0xffffffffffffff00;
            local_3c = 0;
          }
          pDVar20 = D->U;
          llvm::DWARFUnit::extractDIEsIfNeeded(pDVar20,true);
          local_d8.Die = (pDVar20->DieArray).
                         super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          local_d8.U = pDVar20;
          if ((DWARFUnit *)local_d8.Die ==
              (DWARFUnit *)
              (pDVar20->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_d8.Die = (DWARFDebugInfoEntry *)(DWARFUnit *)0x0;
            local_d8.U = (DWARFUnit *)0x0;
          }
          llvm::DWARFDie::find((Optional<llvm::DWARFFormValue> *)this,&local_d8,DW_AT_language);
          aVar22 = extraout_RDX_01;
          if (L.Storage.field_0._40_1_ == '\x01') {
            OVar27 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)this);
            aVar22.value = OVar27.Storage._8_8_;
            if (((undefined1  [16])OVar27.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            goto LAB_00d6f91e;
            OVar11 = (OptionalStorage<unsigned_int,_true>)
                     llvm::dwarf::LanguageLowerBound(OVar27.Storage.field_0._0_4_);
            aVar6 = local_58;
            L.Storage._52_4_ = OVar11._1_4_ & 0xffffff;
            bVar13 = OVar11.hasVal & 1;
            uVar17 = (ulong)local_44;
            aVar22 = extraout_RDX_02;
            if (((bVar13 & (byte)local_40) != 1) ||
               (aVar22 = local_58, (void *)local_58.value != (void *)((ulong)OVar11 & 0xffffffff)))
            goto LAB_00d6f925;
            sVar8 = 0;
            local_58.value = 0;
            aVar22 = aVar6;
            if ((((byte)local_44 | (byte)local_3c) & 1) == 0) goto LAB_00d6f986;
LAB_00d6f965:
            pcVar7 = OS->OutBufCur;
            if (pcVar7 < OS->OutBufEnd) {
              OS->OutBufCur = pcVar7 + 1;
              *pcVar7 = '[';
              prVar12 = OS;
            }
            else {
              prVar12 = (raw_ostream *)llvm::raw_ostream::write(OS,0x5b,(void *)aVar22,sVar8);
            }
            aVar22 = local_60;
            if ((uVar17 & 1) == 0) {
              if ((local_3c & 1) == 0) {
                __assert_fail("hasVal",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                              ,0xad,
                              "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                             );
              }
              aVar22.value = (local_78.value -
                             ((ulong)(uint)(L.Storage._52_4_ << 8) | (ulong)OVar11 & 0xff)) + 1;
            }
            prVar12 = llvm::raw_ostream::operator<<(prVar12,aVar22.value);
            pcVar7 = prVar12->OutBufCur;
            if (pcVar7 < prVar12->OutBufEnd) {
              prVar12->OutBufCur = pcVar7 + 1;
              *pcVar7 = ']';
              pDVar20 = local_50;
            }
            else {
              llvm::raw_ostream::write(prVar12,0x5d,__buf,(size_t)pcVar7);
              pDVar20 = local_50;
            }
          }
          else {
LAB_00d6f91e:
            OVar11.field_0 = (anon_union_4_2_fc7899a5_for_OptionalStorage<unsigned_int,_true>_2)0x0;
            OVar11.hasVal = false;
            OVar11._5_3_ = 0;
            bVar13 = 0;
            uVar17 = (ulong)local_44;
LAB_00d6f925:
            prVar12 = OS;
            if ((local_40 & 1) == 0) {
              bVar14 = (byte)uVar17 | (byte)local_3c;
              sVar8 = CONCAT71((int7)(uVar17 >> 8),bVar14);
              if ((bVar14 & 1) != 0) {
                if (bVar13 != 0) goto LAB_00d6f965;
                pcVar7 = OS->OutBufCur;
                sVar8 = (long)OS->OutBufEnd - (long)pcVar7;
                if (sVar8 < 2) {
                  llvm::raw_ostream::write(OS,0xe5f168,(void *)0x2,sVar8);
                  pcVar7 = OS->OutBufCur;
                  aVar22 = extraout_RDX_05;
                }
                else {
                  pcVar7[0] = '[';
                  pcVar7[1] = '[';
                  pcVar7 = OS->OutBufCur + 2;
                  OS->OutBufCur = pcVar7;
                }
                pDVar20 = local_50;
                if (pcVar7 < OS->OutBufEnd) {
                  OS->OutBufCur = pcVar7 + 1;
                  *pcVar7 = '?';
                }
                else {
                  llvm::raw_ostream::write(OS,0x3f,(void *)aVar22,sVar8);
                  aVar22 = extraout_RDX_06;
                }
                pcVar7 = OS->OutBufCur;
                sVar8 = (long)OS->OutBufEnd - (long)pcVar7;
                if (sVar8 < 2) {
                  llvm::raw_ostream::write(OS,0xe39b3b,(void *)0x2,sVar8);
                  aVar22 = extraout_RDX_07;
                }
                else {
                  pcVar7[0] = ',';
                  pcVar7[1] = ' ';
                  OS->OutBufCur = OS->OutBufCur + 2;
                }
                if ((uVar17 & 1) == 0) goto LAB_00d6fb5e;
                sVar8 = (long)OS->OutBufEnd - (long)OS->OutBufCur;
                if (sVar8 < 4) {
                  prVar12 = (raw_ostream *)llvm::raw_ostream::write(OS,0xe5f16b,(void *)0x4,sVar8);
                  aVar22 = local_60;
                }
                else {
                  builtin_strncpy(OS->OutBufCur,"? + ",4);
                  OS->OutBufCur = OS->OutBufCur + 4;
                  aVar22 = local_60;
                }
                goto LAB_00d6fb73;
              }
LAB_00d6f986:
              pcVar7 = OS->OutBufCur;
              sVar8 = (long)OS->OutBufEnd - (long)pcVar7;
              if (sVar8 < 2) {
                llvm::raw_ostream::write(OS,0xe68e5a,(void *)0x2,sVar8);
                pDVar20 = local_50;
              }
              else {
                pcVar7[0] = '[';
                pcVar7[1] = ']';
                OS->OutBufCur = OS->OutBufCur + 2;
                pDVar20 = local_50;
              }
            }
            else {
              pcVar7 = OS->OutBufCur;
              sVar8 = (long)OS->OutBufEnd - (long)pcVar7;
              if (sVar8 < 2) {
                llvm::raw_ostream::write(OS,0xe5f168,(void *)0x2,sVar8);
              }
              else {
                pcVar7[0] = '[';
                pcVar7[1] = '[';
                OS->OutBufCur = OS->OutBufCur + 2;
              }
              pDVar20 = local_50;
              llvm::raw_ostream::operator<<(OS,local_58.value);
              pcVar7 = OS->OutBufCur;
              sVar8 = (long)OS->OutBufEnd - (long)pcVar7;
              if (sVar8 < 2) {
                llvm::raw_ostream::write(OS,0xe39b3b,(void *)0x2,sVar8);
                aVar22 = extraout_RDX_04;
              }
              else {
                pcVar7[0] = ',';
                pcVar7[1] = ' ';
                OS->OutBufCur = OS->OutBufCur + 2;
                aVar22 = extraout_RDX_03;
              }
              if ((uVar17 & 1) == 0) {
LAB_00d6fb5e:
                if ((local_3c & 1) != 0) {
                  aVar22.value = local_78.value + 1;
                  goto LAB_00d6fb73;
                }
                pcVar7 = OS->OutBufCur;
                if (pcVar7 < OS->OutBufEnd) {
                  OS->OutBufCur = pcVar7 + 1;
                  *pcVar7 = '?';
                }
                else {
                  llvm::raw_ostream::write(OS,0x3f,(void *)aVar22,sVar8);
                }
              }
              else {
                aVar22.value = local_60.value + local_58.value;
LAB_00d6fb73:
                llvm::raw_ostream::operator<<(prVar12,aVar22.value);
              }
              pcVar7 = OS->OutBufCur;
              sVar8 = (long)OS->OutBufEnd - (long)pcVar7;
              if (sVar8 < 2) {
                llvm::raw_ostream::write(OS,0xe58d72,(void *)0x2,sVar8);
              }
              else {
                pcVar7[0] = ')';
                pcVar7[1] = ']';
                OS->OutBufCur = OS->OutBufCur + 2;
              }
            }
          }
          DVar2.Die = (DWARFDebugInfoEntry *)local_38;
          DVar2.U = local_50;
          DVar26.Die = (DWARFDebugInfoEntry *)local_38;
          DVar26.U = pDVar20;
        }
        local_38 = (DWARFUnit *)DVar2.Die;
        local_50 = DVar2.U;
        pDVar20 = (DWARFUnit *)DVar26.Die;
        pDVar23 = DVar26.U;
        if (local_70.Die == (DWARFDebugInfoEntry *)0x0 || local_70.U == (DWARFUnit *)0x0) {
          local_70 = (DWARFDie)ZEXT816(0);
        }
        else {
          local_70 = llvm::DWARFUnit::getSibling(local_70.U,local_70.Die);
          DVar2.Die = (DWARFDebugInfoEntry *)local_38;
          DVar2.U = local_50;
          pDVar20 = local_38;
        }
        DVar1.Die = (DWARFDebugInfoEntry *)pDVar20;
        DVar1.U = pDVar23;
        DVar26.Die = (DWARFDebugInfoEntry *)pDVar20;
        DVar26.U = pDVar23;
        if (local_70 == DVar1) {
          return;
        }
      } while( true );
    }
    pDVar19 = extraout_RDX;
    if (Tag != 0xf) {
      if (Tag != 0x10) {
        return;
      }
      pcVar7 = OS->OutBufCur;
      if (pcVar7 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar7 + 1;
        *pcVar7 = '&';
        return;
      }
      __fd = 0x26;
      goto LAB_00d6fe0f;
    }
  }
  else {
    if (Tag == 0x42) {
      Str_01.Length = 2;
      Str_01.Data = "&&";
      llvm::raw_ostream::operator<<(OS,Str_01);
      return;
    }
    if (Tag != 0x1f) {
      if (Tag != 0x15) {
        return;
      }
      if ((local_c8 == (undefined1  [8])0x0) ||
         (pDVar19 = extraout_RDX, TypeDie.U == (DWARFUnit *)0x0)) {
        Str_00.Length = 4;
        Str_00.Data = "void";
        llvm::raw_ostream::operator<<(OS,Str_00);
        pDVar19 = extraout_RDX_00;
      }
      pcVar7 = OS->OutBufCur;
      if (pcVar7 < OS->OutBufEnd) {
        in_RCX = pcVar7 + 1;
        OS->OutBufCur = in_RCX;
        *pcVar7 = '(';
      }
      else {
        llvm::raw_ostream::write(OS,0x28,pDVar19,(size_t)in_RCX);
        pDVar19 = extraout_RDX_08;
      }
      pDVar20 = D->U;
      pDVar21 = D->Die;
      uVar16 = (undefined7)((ulong)in_RCX >> 8);
      if (pDVar21 == (DWARFDebugInfoEntry *)0x0 || pDVar20 == (DWARFUnit *)0x0) {
        unique0x100004f0 = (DWARFDie)ZEXT816(0);
      }
      else {
        join_0x00000010_0x00000000_ = llvm::DWARFUnit::getFirstChild(pDVar20,pDVar21);
        pDVar19 = TypeDie._16_8_;
        pDVar20 = D->U;
        pDVar21 = D->Die;
      }
      in_RCX = (char *)CONCAT71(uVar16,pDVar21 != (DWARFDebugInfoEntry *)0x0 &&
                                       pDVar20 != (DWARFUnit *)0x0);
      if (pDVar21 != (DWARFDebugInfoEntry *)0x0 && pDVar20 != (DWARFUnit *)0x0) {
        DVar28 = llvm::DWARFUnit::getLastChild(pDVar20,pDVar21);
        pDVar19 = DVar28.Die;
      }
      else {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pDVar19;
        DVar28 = (DWARFDie)(auVar4 << 0x40);
        pDVar19 = (DWARFDebugInfoEntry *)0x0;
      }
      local_38 = DVar28.U;
      DVar29.Die = pDVar19;
      DVar29.U = local_38;
      if (unique0x100004e0 != DVar29) {
        bVar24 = true;
        do {
          pDVar21 = DVar28.Die;
          local_38 = DVar28.U;
          DVar3.Die = (DWARFDebugInfoEntry *)local_38;
          DVar3.U = local_50;
          DVar2.Die = (DWARFDebugInfoEntry *)local_38;
          DVar2.U = local_50;
          if ((TypeDie._16_8_ == (DWARFDebugInfoEntry *)0x0) ||
             (DVar2 = DVar3, TypeDie.Die == (DWARFUnit *)0x0)) goto LAB_00d6fe26;
          pDVar9 = (TypeDie._16_8_)->AbbrevDecl;
          if ((pDVar9 != (DWARFAbbreviationDeclaration *)0x0) &&
             (pDVar9->Tag == DW_TAG_formal_parameter)) {
            if (!bVar24) {
              Str_02.Length = 2;
              Str_02.Data = ", ";
              llvm::raw_ostream::operator<<(OS,Str_02);
            }
            local_70 = llvm::DWARFDie::getAttributeValueAsReferencedDie
                                 ((DWARFDie *)&TypeDie.Die,DW_AT_type);
            dumpTypeName(OS,&local_70);
            bVar24 = false;
            pDVar21 = extraout_RDX_09;
          }
          if (TypeDie.Die == (DWARFUnit *)0x0) {
            DVar29 = (DWARFDie)ZEXT816(0);
          }
          else {
            DVar29 = (DWARFDie)ZEXT816(0);
            if (TypeDie._16_8_ != (DWARFDebugInfoEntry *)0x0) {
              DVar29 = llvm::DWARFUnit::getSibling(TypeDie.Die,TypeDie._16_8_);
              pDVar21 = DVar29.Die;
            }
          }
          DVar5.Die = pDVar19;
          DVar5.U = local_38;
          DVar28.Die = pDVar21;
          DVar28.U = local_38;
          unique0x10000e33 = DVar29;
        } while (DVar29 != DVar5);
      }
      pcVar7 = OS->OutBufCur;
      if (pcVar7 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar7 + 1;
        *pcVar7 = ')';
        return;
      }
      __fd = 0x29;
      goto LAB_00d6fe0f;
    }
    join_0x00000010_0x00000000_ =
         llvm::DWARFDie::getAttributeValueAsReferencedDie(D,DW_AT_containing_type);
    pDVar19 = TypeDie._16_8_;
    bVar24 = TypeDie.Die != (DWARFUnit *)0x0;
    in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),
                              pDVar19 != (DWARFDebugInfoEntry *)0x0 && bVar24);
    if (pDVar19 != (DWARFDebugInfoEntry *)0x0 && bVar24) {
      pcVar7 = OS->OutBufCur;
      if (pcVar7 < OS->OutBufEnd) {
        in_RCX = pcVar7 + 1;
        OS->OutBufCur = in_RCX;
        *pcVar7 = ' ';
        prVar12 = OS;
      }
      else {
        prVar12 = (raw_ostream *)llvm::raw_ostream::write(OS,0x20,pDVar19,(size_t)in_RCX);
      }
      dumpTypeName(prVar12,(DWARFDie *)&TypeDie.Die);
      Str_03.Length = 2;
      Str_03.Data = "::";
      llvm::raw_ostream::operator<<(OS,Str_03);
      pDVar19 = extraout_RDX_10;
    }
  }
  DVar28.Die = pDVar19;
  DVar28.U = local_38;
  pcVar7 = OS->OutBufCur;
  if (pcVar7 < OS->OutBufEnd) {
    OS->OutBufCur = pcVar7 + 1;
    *pcVar7 = '*';
    return;
  }
  __fd = 0x2a;
LAB_00d6fe0f:
  local_38 = DVar28.U;
  llvm::raw_ostream::write(OS,__fd,DVar28.Die,(size_t)in_RCX);
  return;
}

Assistant:

static void dumpTypeName(raw_ostream &OS, const DWARFDie &D) {
  if (!D.isValid())
    return;

  if (const char *Name = D.getName(DINameKind::LinkageName)) {
    OS << Name;
    return;
  }

  // FIXME: We should have pretty printers per language. Currently we print
  // everything as if it was C++ and fall back to the TAG type name.
  const dwarf::Tag T = D.getTag();
  switch (T) {
  case DW_TAG_array_type:
  case DW_TAG_pointer_type:
  case DW_TAG_ptr_to_member_type:
  case DW_TAG_reference_type:
  case DW_TAG_rvalue_reference_type:
  case DW_TAG_subroutine_type:
    break;
  default:
    dumpTypeTagName(OS, T);
  }

  // Follow the DW_AT_type if possible.
  DWARFDie TypeDie = D.getAttributeValueAsReferencedDie(DW_AT_type);
  dumpTypeName(OS, TypeDie);

  switch (T) {
  case DW_TAG_subroutine_type: {
    if (!TypeDie)
      OS << "void";
    OS << '(';
    bool First = true;
    for (const DWARFDie &C : D.children()) {
      if (C.getTag() == DW_TAG_formal_parameter) {
        if (!First)
          OS << ", ";
        First = false;
        dumpTypeName(OS, C.getAttributeValueAsReferencedDie(DW_AT_type));
      }
    }
    OS << ')';
    break;
  }
  case DW_TAG_array_type: {
    dumpArrayType(OS, D);
    break;
  }
  case DW_TAG_pointer_type:
    OS << '*';
    break;
  case DW_TAG_ptr_to_member_type:
    if (DWARFDie Cont =
            D.getAttributeValueAsReferencedDie(DW_AT_containing_type)) {
      dumpTypeName(OS << ' ', Cont);
      OS << "::";
    }
    OS << '*';
    break;
  case DW_TAG_reference_type:
    OS << '&';
    break;
  case DW_TAG_rvalue_reference_type:
    OS << "&&";
    break;
  default:
    break;
  }
}